

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioIdentifier.cpp
# Opt level: O0

int __thiscall DIS::RadioIdentifier::getMarshalledSize(RadioIdentifier *this)

{
  int marshalSize;
  RadioIdentifier *this_local;
  
  return 8;
}

Assistant:

int RadioIdentifier::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 2;  // _siteNumber
   marshalSize = marshalSize + 2;  // _applicationNumber
   marshalSize = marshalSize + 2;  // _referenceNumber
   marshalSize = marshalSize + 2;  // _radioNumber
    return marshalSize;
}